

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlIsXHTML(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 local_40;
  xmlChar *publicID;
  xmlChar *systemID;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"zz:xmlIsXHTML",&publicID,&local_40);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    systemID._4_4_ = xmlIsXHTML(publicID,local_40);
    self_local = libxml_intWrap(systemID._4_4_);
  }
  return self_local;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlIsXHTML(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlChar * systemID;
    xmlChar * publicID;

    if (!PyArg_ParseTuple(args, (char *)"zz:xmlIsXHTML", &systemID, &publicID))
        return(NULL);

    c_retval = xmlIsXHTML(systemID, publicID);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}